

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

string * __thiscall Operand::str_abi_cxx11_(Operand *this)

{
  int *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char *in_stack_00000028;
  
  if (*in_RSI == 2) {
    std::operator+(in_stack_00000028,in_stack_00000020);
  }
  else {
    std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 2));
  }
  return in_RDI;
}

Assistant:

string str() const { return kind != OP_INTCONST ? value : "#" + value; }